

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

token * parse_static_assert(dmr_C *C,token *token,symbol_list **unused)

{
  expression *peVar1;
  token *ptVar2;
  longlong lVar3;
  char *pcVar4;
  token *ptVar5;
  expression *local_38;
  expression *message;
  expression *cond;
  
  message = (expression *)0x0;
  local_38 = (expression *)0x0;
  ptVar2 = dmrC_expect_token(C,token->next,0x28,"after _Static_assert");
  ptVar2 = dmrC_conditional_expression(C,ptVar2,&message);
  if (message == (expression *)0x0) {
    dmrC_sparse_error(C,ptVar2->pos,"Expected constant expression");
  }
  ptVar2 = dmrC_expect_token(C,ptVar2,0x2c,"after conditional expression in _Static_assert");
  ptVar2 = dmrC_parse_expression(C,ptVar2,&local_38);
  if ((local_38 == (expression *)0x0) || (*(char *)local_38 != '\x02')) {
    ptVar5 = (token *)&local_38->pos;
    if (local_38 == (expression *)0x0) {
      ptVar5 = ptVar2;
    }
    dmrC_sparse_error(C,ptVar5->pos,"bad or missing string literal");
    message = (expression *)0x0;
  }
  ptVar2 = dmrC_expect_token(C,ptVar2,0x29,"after diagnostic message in _Static_assert");
  ptVar2 = dmrC_expect_token(C,ptVar2,0x3b,"after _Static_assert()");
  if (message != (expression *)0x0) {
    lVar3 = dmrC_const_expression_value(C,message);
    peVar1 = message;
    if ((lVar3 == 0) && (*(char *)message == '\x01')) {
      pcVar4 = dmrC_show_string(C,(local_38->field_5).field_2.string);
      dmrC_sparse_error(C,peVar1->pos,"static assertion failed: %s",pcVar4);
    }
  }
  return ptVar2;
}

Assistant:

static struct token *parse_static_assert(struct dmr_C *C, struct token *token, struct symbol_list **unused)
{
        (void) unused;
	struct expression *cond = NULL, *message = NULL;

	token = dmrC_expect_token(C, token->next, '(', "after _Static_assert");
	token = dmrC_constant_expression(C, token, &cond);
	if (!cond)
		dmrC_sparse_error(C, token->pos, "Expected constant expression");
	token = dmrC_expect_token(C, token, ',', "after conditional expression in _Static_assert");
	token = dmrC_parse_expression(C, token, &message);
	if (!message || message->type != EXPR_STRING) {
		struct position pos;

		pos = message ? message->pos : token->pos;
		dmrC_sparse_error(C, pos, "bad or missing string literal");
		cond = NULL;
	}
	token = dmrC_expect_token(C, token, ')', "after diagnostic message in _Static_assert");

	token = dmrC_expect_token(C, token, ';', "after _Static_assert()");

	if (cond && !dmrC_const_expression_value(C, cond) && cond->type == EXPR_VALUE)
		dmrC_sparse_error(C, cond->pos, "static assertion failed: %s",
			     dmrC_show_string(C, message->string));
	return token;
}